

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.cpp
# Opt level: O1

VkSurfaceKHR
create_surface_glfw(VkInstance instance,GLFWwindow *window,VkAllocationCallbacks *allocator)

{
  VkResult VVar1;
  int iVar2;
  ostream *poVar3;
  size_t sVar4;
  VkSurfaceKHR surface;
  char *error_msg;
  VkSurfaceKHR local_18;
  char *local_10;
  
  local_18 = (VkSurfaceKHR)0x0;
  VVar1 = glfwCreateWindowSurface(instance,window,allocator,(VkSurfaceKHR_conflict *)&local_18);
  if (VVar1 != VK_SUCCESS) {
    iVar2 = glfwGetError(&local_10);
    if (iVar2 != 0) {
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      if (local_10 != (char *)0x0) {
        sVar4 = strlen(local_10);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_10,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
    }
    local_18 = (VkSurfaceKHR)0x0;
  }
  return local_18;
}

Assistant:

VkSurfaceKHR create_surface_glfw(VkInstance instance, GLFWwindow* window, VkAllocationCallbacks* allocator = nullptr) {
    VkSurfaceKHR surface = VK_NULL_HANDLE;
    VkResult err = glfwCreateWindowSurface(instance, window, allocator, &surface);
    if (err) {
        const char* error_msg;
        int ret = glfwGetError(&error_msg);
        if (ret != 0) {
            std::cout << ret << " ";
            if (error_msg != nullptr) std::cout << error_msg;
            std::cout << "\n";
        }
        surface = VK_NULL_HANDLE;
    }
    return surface;
}